

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

bool __thiscall cmCTestMultiProcessHandler::CheckCycles(cmCTestMultiProcessHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  reference ppVar5;
  reference pvVar6;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  reference __x;
  mapped_type *ppcVar7;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  string local_5e8 [32];
  ostringstream local_5c8 [8];
  ostringstream cmCTestLog_msg_2;
  string local_448 [32];
  undefined1 local_428 [8];
  ostringstream cmCTestLog_msg_1;
  int *d;
  iterator __end4;
  iterator __begin4;
  mapped_type *__range4;
  value_type local_26c;
  undefined1 local_268 [4];
  int test;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  int root;
  pair<const_int,_cmCTestMultiProcessHandler::TestSet> *it;
  iterator __end1;
  iterator __begin1;
  TestMap *__range1;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestMultiProcessHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Checking test dependency graph...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x586,pcVar4,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  __end1 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::begin(&(this->Tests).
                    super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  );
  it = (pair<const_int,_cmCTestMultiProcessHandler::TestSet> *)
       std::
       map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ::end(&(this->Tests).
              super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
            );
  while (bVar2 = std::operator!=(&__end1,(_Self *)&it), bVar2) {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::
             operator*(&__end1);
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = ppVar5->first;
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node);
    std::stack<int,std::deque<int,std::allocator<int>>>::
    stack<std::deque<int,std::allocator<int>>,void>
              ((stack<int,std::deque<int,std::allocator<int>>> *)local_268);
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_268,
               (value_type *)((long)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    while (bVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                             ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_268),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pvVar6 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                         ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_268);
      local_26c = *pvVar6;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_268);
      pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         &s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node,&local_26c);
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this_00 = &std::
                   map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                   ::operator[](&(this->Tests).
                                 super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                                ,&local_26c)->super_set<int,_std::less<int>,_std::allocator<int>_>;
        __end4 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(this_00);
        d = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end(this_00);
        while (bVar2 = std::operator!=(&__end4,(_Self *)&d), bVar2) {
          __x = std::_Rb_tree_const_iterator<int>::operator*(&__end4);
          if (*__x == visited._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
            poVar3 = std::operator<<((ostream *)local_428,
                                     "Error: a cycle exists in the test dependency graph for the test \""
                                    );
            ppcVar7 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&(this->Properties).
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,(key_type *)
                                    ((long)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count
                                    + 4));
            poVar3 = std::operator<<(poVar3,(string *)*ppcVar7);
            std::operator<<(poVar3,"\".\nPlease fix the cycle and run ctest again.\n");
            pcVar1 = this->CTest;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x599,pcVar4,false);
            std::__cxx11::string::~string(local_448);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
            this_local._7_1_ = 0;
            bVar2 = true;
            goto LAB_0023bcff;
          }
          std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
                    ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_268,__x);
          std::_Rb_tree_const_iterator<int>::operator++(&__end4);
        }
      }
    }
    bVar2 = false;
LAB_0023bcff:
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::~stack
              ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_268);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node);
    if (bVar2) goto LAB_0023be67;
    std::_Rb_tree_iterator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>::operator++
              (&__end1);
  }
  std::__cxx11::ostringstream::ostringstream(local_5c8);
  poVar3 = std::operator<<((ostream *)local_5c8,"Checking test dependency graph end");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x5a3,pcVar4,(bool)(this->Quiet & 1));
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::ostringstream::~ostringstream(local_5c8);
  this_local._7_1_ = 1;
LAB_0023be67:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestMultiProcessHandler::CheckCycles()
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph..." << std::endl,
                     this->Quiet);
  for (auto const& it : this->Tests) {
    // DFS from each element to itself
    int root = it.first;
    std::set<int> visited;
    std::stack<int> s;
    s.push(root);
    while (!s.empty()) {
      int test = s.top();
      s.pop();
      if (visited.insert(test).second) {
        for (auto const& d : this->Tests[test]) {
          if (d == root) {
            // cycle exists
            cmCTestLog(
              this->CTest, ERROR_MESSAGE,
              "Error: a cycle exists in the test dependency graph "
              "for the test \""
                << this->Properties[root]->Name
                << "\".\nPlease fix the cycle and run ctest again.\n");
            return false;
          }
          s.push(d);
        }
      }
    }
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Checking test dependency graph end" << std::endl,
                     this->Quiet);
  return true;
}